

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int libssh2_sftp_fstat_ex(LIBSSH2_SFTP_HANDLE *hnd,LIBSSH2_SFTP_ATTRIBUTES *attrs,int setstat)

{
  time_t start_time;
  time_t entry_time;
  int rc;
  int setstat_local;
  LIBSSH2_SFTP_ATTRIBUTES *attrs_local;
  LIBSSH2_SFTP_HANDLE *hnd_local;
  
  if ((hnd == (LIBSSH2_SFTP_HANDLE *)0x0) || (attrs == (LIBSSH2_SFTP_ATTRIBUTES *)0x0)) {
    hnd_local._4_4_ = -0x27;
  }
  else {
    start_time = time((time_t *)0x0);
    do {
      entry_time._0_4_ = sftp_fstat(hnd,attrs,setstat);
      if (((int)entry_time != -0x25) || (hnd->sftp->channel->session->api_block_mode == 0)) break;
      entry_time._0_4_ = _libssh2_wait_socket(hnd->sftp->channel->session,start_time);
    } while ((int)entry_time == 0);
    hnd_local._4_4_ = (int)entry_time;
  }
  return hnd_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_sftp_fstat_ex(LIBSSH2_SFTP_HANDLE *hnd,
                      LIBSSH2_SFTP_ATTRIBUTES *attrs, int setstat)
{
    int rc;
    if(!hnd || !attrs)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, hnd->sftp->channel->session,
                 sftp_fstat(hnd, attrs, setstat));
    return rc;
}